

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void Rml::Parse::Function
               (DataParser *parser,Instruction function_type,String *func_name,
               bool first_argument_piped)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uint num_arguments;
  size_type local_58;
  String local_50;
  
  if (((function_type != EventFnc) && (function_type != TransformFnc)) &&
     (bVar2 = Assert("RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0x363), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  num_arguments = (uint)first_argument_piped;
  if ((parser->reached_end == false) &&
     ((parser->expression)._M_dataplus._M_p[parser->index] == '(')) {
    DataParser::Match(parser,'(',true);
    bVar2 = true;
    if ((parser->reached_end == false) &&
       ((parser->expression)._M_dataplus._M_p[parser->index] == ')')) {
      DataParser::Match(parser,')',true);
      bVar2 = false;
    }
    if (bVar2) {
      do {
        Expression(parser);
        DataParser::Push(parser);
        if (parser->reached_end == false) {
          cVar3 = (parser->expression)._M_dataplus._M_p[parser->index];
        }
        else {
          cVar3 = '\0';
        }
        if (cVar3 == ',') {
          DataParser::Match(parser,',',true);
        }
        else {
          if (cVar3 == ')') {
            DataParser::Match(parser,')',true);
          }
          else {
            local_58 = 0x11;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            local_50._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
            local_50.field_2._M_allocated_capacity = local_58;
            builtin_strncpy(local_50._M_dataplus._M_p,"one of \')\' or \',\'",0x11);
            local_50._M_string_length = local_58;
            local_50._M_dataplus._M_p[local_58] = '\0';
            DataParser::Expected(parser,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          bVar2 = false;
        }
        num_arguments = num_arguments + 1;
      } while (bVar2);
    }
  }
  else {
    DataParser::SkipWhitespace(parser);
  }
  DataParser::Function(parser,function_type,num_arguments,func_name);
  return;
}

Assistant:

static void Function(DataParser& parser, Instruction function_type, String&& func_name, bool first_argument_piped)
	{
		RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc);

		// We already matched the variable name, and also pushed the first argument to the stack if it was piped using '|'.
		int num_arguments = first_argument_piped ? 1 : 0;
		if (parser.Look() == '(')
		{
			bool looping = true;

			parser.Match('(');
			if (parser.Look() == ')')
			{
				parser.Match(')');
				looping = false;
			}

			while (looping)
			{
				num_arguments += 1;
				Expression(parser);
				parser.Push();

				switch (parser.Look())
				{
				case ')':
					parser.Match(')');
					looping = false;
					break;
				case ',': parser.Match(','); break;
				default:
					parser.Expected("one of ')' or ','");
					looping = false;
					break;
				}
			}
		}
		else
		{
			parser.SkipWhitespace();
		}

		parser.Function(function_type, num_arguments, std::move(func_name));
	}